

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall
QGridLayoutPrivate::setupLayoutData(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  QList<QLayoutStruct> *chain;
  QList<QLayoutStruct> *chain_00;
  int iVar1;
  int iVar2;
  QLayout *this_00;
  int *piVar3;
  int *piVar4;
  qsizetype qVar5;
  QGridBox *pQVar6;
  QLayoutStruct *pQVar7;
  int iVar8;
  pointer pQVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  long in_FS_OFFSET;
  QVarLengthArray<QGridBox_*,_256LL> grid;
  QVarLengthArray<QGridLayoutSizeTriple,_256LL> sizes;
  long local_2068;
  long local_2060;
  QGridBox **local_2058;
  QGridBox *local_2050 [256];
  long local_1850;
  long local_1848;
  undefined1 *local_1840;
  undefined1 local_1838 [6144];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x194 & 4) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    this->field_0x194 = this->field_0x194 & 0xf7;
    if (0 < this->rr) {
      lVar18 = 2;
      lVar14 = 0;
      do {
        pQVar9 = QList<QLayoutStruct>::data(&this->rowData);
        piVar3 = (this->rStretch).d.ptr;
        piVar4 = (this->rMinHeights).d.ptr;
        iVar8 = piVar4[lVar14];
        *(int *)((long)pQVar9 + lVar18 * 4 + -8) = piVar3[lVar14];
        *(int *)((long)pQVar9 + lVar18 * 4 + -4) = iVar8;
        (&pQVar9->sizeHint)[lVar18] = iVar8;
        (&pQVar9->stretch)[lVar18] = 0x7ffff;
        *(undefined2 *)(&pQVar9->minimumSize + lVar18) = 0x100;
        (&pQVar9->maximumSize)[lVar18] = 0;
        iVar8 = 0x7ffff;
        if (piVar3[lVar14] == 0) {
          iVar8 = piVar4[lVar14];
        }
        pQVar9 = QList<QLayoutStruct>::data(&this->rowData);
        (&pQVar9->stretch)[lVar18] = iVar8;
        lVar14 = lVar14 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar14 < this->rr);
    }
    if (0 < this->cc) {
      lVar18 = 2;
      lVar14 = 0;
      do {
        pQVar9 = QList<QLayoutStruct>::data(&this->colData);
        piVar3 = (this->cStretch).d.ptr;
        piVar4 = (this->cMinWidths).d.ptr;
        iVar8 = piVar4[lVar14];
        *(int *)((long)pQVar9 + lVar18 * 4 + -8) = piVar3[lVar14];
        *(int *)((long)pQVar9 + lVar18 * 4 + -4) = iVar8;
        (&pQVar9->sizeHint)[lVar18] = iVar8;
        (&pQVar9->stretch)[lVar18] = 0x7ffff;
        *(undefined2 *)(&pQVar9->minimumSize + lVar18) = 0x100;
        (&pQVar9->maximumSize)[lVar18] = 0;
        iVar8 = 0x7ffff;
        if (piVar3[lVar14] == 0) {
          iVar8 = piVar4[lVar14];
        }
        pQVar9 = QList<QLayoutStruct>::data(&this->colData);
        (&pQVar9->stretch)[lVar18] = iVar8;
        lVar14 = lVar14 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar14 < this->cc);
    }
    qVar5 = (this->things).d.size;
    memset(&local_1850,0xaa,0x1818);
    uVar11 = (uint)qVar5;
    lVar14 = (long)(int)uVar11;
    local_1850 = 0x100;
    local_1848 = 0;
    local_1840 = local_1838;
    if (0x100 < lVar14) {
      setupLayoutData();
    }
    if (0 < lVar14) {
      memset(local_1840,0xff,lVar14 * 0x18);
    }
    local_1848 = lVar14;
    memset(&local_2068,0xaa,0x818);
    lVar14 = (long)this->cc * (long)this->rr;
    local_2068 = 0x100;
    local_2060 = 0;
    local_2058 = local_2050;
    if (0x100 < (int)lVar14) {
      setupLayoutData();
    }
    bVar17 = 0;
    local_2060 = lVar14;
    memset(local_2058,0,lVar14 * 8);
    if (0 < (int)uVar11) {
      uVar16 = 0;
      bVar17 = 0;
      do {
        pQVar6 = (this->things).d.ptr[uVar16];
        iVar8 = (*pQVar6->item_->_vptr_QLayoutItem[3])();
        lVar14 = uVar16 * 0x18;
        *(ulong *)(local_1840 + lVar14) = CONCAT44(extraout_var,iVar8);
        iVar8 = (*pQVar6->item_->_vptr_QLayoutItem[2])();
        *(ulong *)(local_1840 + lVar14 + 8) = CONCAT44(extraout_var_00,iVar8);
        iVar8 = (*pQVar6->item_->_vptr_QLayoutItem[4])();
        *(ulong *)(local_1840 + lVar14 + 0x10) = CONCAT44(extraout_var_01,iVar8);
        iVar8 = (*pQVar6->item_->_vptr_QLayoutItem[9])();
        if ((char)iVar8 != '\0') {
          this->field_0x194 = this->field_0x194 | 8;
        }
        iVar8 = this->rr + -1;
        if (-1 < pQVar6->torow) {
          iVar8 = pQVar6->torow;
        }
        if (pQVar6->row == iVar8) {
          addData(this,pQVar6,(QGridLayoutSizeTriple *)(local_1840 + uVar16 * 0x18),true,false);
        }
        else {
          initEmptyMultiBox(&this->rowData,pQVar6->row,iVar8);
          bVar17 = 1;
        }
        iVar8 = this->cc + -1;
        if (-1 < pQVar6->tocol) {
          iVar8 = pQVar6->tocol;
        }
        if (pQVar6->col == iVar8) {
          addData(this,pQVar6,(QGridLayoutSizeTriple *)(local_1840 + uVar16 * 0x18),false,true);
        }
        else {
          initEmptyMultiBox(&this->colData,pQVar6->col,iVar8);
          bVar17 = 1;
        }
        lVar14 = (long)pQVar6->row;
        iVar8 = this->rr + -1;
        if (-1 < pQVar6->torow) {
          iVar8 = pQVar6->torow;
        }
        if (pQVar6->row <= iVar8) {
          iVar15 = this->cc;
          iVar2 = iVar15 + -1;
          if (-1 < pQVar6->tocol) {
            iVar2 = pQVar6->tocol;
          }
          iVar1 = pQVar6->col;
          lVar18 = lVar14 * iVar15 + (long)iVar1;
          do {
            lVar13 = lVar18;
            iVar12 = (iVar2 - iVar1) + 1;
            if (iVar1 <= iVar2) {
              do {
                local_2058[lVar13] = pQVar6;
                lVar13 = lVar13 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            lVar14 = lVar14 + 1;
            lVar18 = lVar18 + iVar15;
          } while (iVar8 + 1 != (int)lVar14);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar11 & 0x7fffffff));
    }
    chain = &this->colData;
    setupSpacings(this,chain,local_2058,hSpacing,Horizontal);
    chain_00 = &this->rowData;
    setupSpacings(this,chain_00,local_2058,vSpacing,Vertical);
    if (!(bool)(~bVar17 & 1) && 0 < (int)uVar11) {
      lVar14 = 1;
      uVar16 = 0;
      do {
        pQVar6 = (this->things).d.ptr[uVar16];
        iVar8 = pQVar6->row;
        iVar15 = this->rr + -1;
        if (-1 < pQVar6->torow) {
          iVar15 = pQVar6->torow;
        }
        if (iVar8 != iVar15) {
          iVar2 = *(int *)(local_1840 + lVar14 * 8 + -4);
          iVar1 = *(int *)(local_1840 + lVar14 * 8 + 4);
          iVar12 = QGridBox::vStretch(pQVar6);
          distributeMultiBox(chain_00,iVar8,iVar15,iVar2,iVar1,&this->rStretch,iVar12);
        }
        iVar8 = pQVar6->col;
        iVar15 = this->cc + -1;
        if (-1 < pQVar6->tocol) {
          iVar15 = pQVar6->tocol;
        }
        if (iVar8 != iVar15) {
          iVar2 = *(int *)(local_1840 + lVar14 * 8 + -8);
          iVar1 = *(int *)(local_1840 + lVar14 * 8);
          iVar12 = QGridBox::hStretch(pQVar6);
          distributeMultiBox(chain,iVar8,iVar15,iVar2,iVar1,&this->cStretch,iVar12);
        }
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 3;
      } while ((uVar11 & 0x7fffffff) != uVar16);
    }
    if (0 < this->rr) {
      lVar14 = 0x14;
      lVar18 = 0;
      do {
        pQVar7 = (this->rowData).d.ptr;
        bVar10 = true;
        if (*(char *)((long)&pQVar7->stretch + lVar14) == '\0') {
          bVar10 = 0 < *(int *)((long)pQVar7 + lVar14 + -0x14);
        }
        pQVar9 = QList<QLayoutStruct>::data(chain_00);
        *(bool *)((long)&pQVar9->stretch + lVar14) = bVar10;
        lVar18 = lVar18 + 1;
        lVar14 = lVar14 + 0x20;
      } while (lVar18 < this->rr);
    }
    if (0 < this->cc) {
      lVar14 = 0x14;
      lVar18 = 0;
      do {
        pQVar7 = (this->colData).d.ptr;
        bVar10 = true;
        if (*(char *)((long)&pQVar7->stretch + lVar14) == '\0') {
          bVar10 = 0 < *(int *)((long)pQVar7 + lVar14 + -0x14);
        }
        pQVar9 = QList<QLayoutStruct>::data(chain);
        *(bool *)((long)&pQVar9->stretch + lVar14) = bVar10;
        lVar18 = lVar18 + 1;
        lVar14 = lVar14 + 0x20;
      } while (lVar18 < this->cc);
    }
    QLayout::getContentsMargins
              (this_00,&this->leftMargin,&this->topMargin,&this->rightMargin,&this->bottomMargin);
    this->field_0x194 = this->field_0x194 & 0xfb;
    if (local_2058 != local_2050) {
      QtPrivate::sizedFree(local_2058,local_2068 << 3);
    }
    if (local_1840 != local_1838) {
      QtPrivate::sizedFree(local_1840,local_1850 * 0x18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupLayoutData(int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);

#ifndef QT_LAYOUT_DISABLE_CACHING
    if (!needRecalc)
        return;
#endif
    has_hfw = false;
    int i;

    for (i = 0; i < rr; i++) {
        rowData[i].init(rStretch.at(i), rMinHeights.at(i));
        rowData[i].maximumSize = rStretch.at(i) ? QLAYOUTSIZE_MAX : rMinHeights.at(i);
    }
    for (i = 0; i < cc; i++) {
        colData[i].init(cStretch.at(i), cMinWidths.at(i));
        colData[i].maximumSize = cStretch.at(i) ? QLAYOUTSIZE_MAX : cMinWidths.at(i);
    }

    int n = things.size();
    QVarLengthArray<QGridLayoutSizeTriple> sizes(n);

    bool has_multi = false;

    /*
        Grid of items. We use it to determine which items are
        adjacent to which and compute the spacings correctly.
    */
    QVarLengthArray<QGridBox *> grid(rr * cc);
    memset(grid.data(), 0, rr * cc * sizeof(QGridBox *));

    /*
        Initialize 'sizes' and 'grid' data structures, and insert
        non-spanning items to our row and column data structures.
    */
    for (i = 0; i < n; ++i) {
        QGridBox * const box = things.at(i);
        sizes[i].minS = box->minimumSize();
        sizes[i].hint = box->sizeHint();
        sizes[i].maxS = box->maximumSize();

        if (box->hasHeightForWidth())
            has_hfw = true;

        if (box->row == box->toRow(rr)) {
            addData(box, sizes[i], true, false);
        } else {
            initEmptyMultiBox(rowData, box->row, box->toRow(rr));
            has_multi = true;
        }

        if (box->col == box->toCol(cc)) {
            addData(box, sizes[i], false, true);
        } else {
            initEmptyMultiBox(colData, box->col, box->toCol(cc));
            has_multi = true;
        }

        for (int r = box->row; r <= box->toRow(rr); ++r) {
            for (int c = box->col; c <= box->toCol(cc); ++c) {
                gridAt(grid.data(), r, c, cc) = box;
            }
        }
    }

    setupSpacings(colData, grid.data(), hSpacing, Qt::Horizontal);
    setupSpacings(rowData, grid.data(), vSpacing, Qt::Vertical);

    /*
        Insert multicell items to our row and column data structures.
        This must be done after the non-spanning items to obtain a
        better distribution in distributeMultiBox().
    */
    if (has_multi) {
        for (i = 0; i < n; ++i) {
            QGridBox * const box = things.at(i);

            if (box->row != box->toRow(rr))
                distributeMultiBox(rowData, box->row, box->toRow(rr), sizes[i].minS.height(),
                                   sizes[i].hint.height(), rStretch, box->vStretch());
            if (box->col != box->toCol(cc))
                distributeMultiBox(colData, box->col, box->toCol(cc), sizes[i].minS.width(),
                                   sizes[i].hint.width(), cStretch, box->hStretch());
        }
    }

    for (i = 0; i < rr; i++)
        rowData[i].expansive = rowData.at(i).expansive || rowData.at(i).stretch > 0;
    for (i = 0; i < cc; i++)
        colData[i].expansive = colData.at(i).expansive || colData.at(i).stretch > 0;

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    needRecalc = false;
}